

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *
Catch::Generators::
makeGenerators<unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>>
          (unary_op_tuple<trng::portable_impl::uint128,_double> *val,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators_1,
          unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators_2)

{
  unary_op_tuple<trng::portable_impl::uint128,_double> *in_RDX;
  Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *in_RDI;
  Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *moreGenerators_2_00;
  unary_op_tuple<trng::portable_impl::uint128,_double> *moreGenerators_1_00;
  unary_op_tuple<trng::portable_impl::uint128,_double> *in_stack_ffffffffffffffc0;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *in_stack_ffffffffffffffc8
  ;
  unary_op_tuple<trng::portable_impl::uint128,_double> local_30;
  
  moreGenerators_1_00 = &local_30;
  moreGenerators_2_00 = in_RDI;
  value<unary_op_tuple<trng::portable_impl::uint128,double>>(in_RDX);
  makeGenerators<unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>,unary_op_tuple<trng::portable_impl::uint128,double>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,moreGenerators_1_00,
             (unary_op_tuple<trng::portable_impl::uint128,_double> *)moreGenerators_2_00);
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_>::~GeneratorWrapper
            ((GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *)0x430267);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }